

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cpp
# Opt level: O3

void libtorrent::aux::ssl::set_context(stream_handle_type s,context_handle_type c)

{
  int mode;
  int iVar1;
  undefined4 extraout_var;
  X509_STORE_CTX *pXVar2;
  
  pXVar2 = (X509_STORE_CTX *)c;
  SSL_set_SSL_CTX((SSL *)s,(SSL_CTX *)c);
  mode = SSL_CTX_get_verify_mode((SSL_CTX *)c);
  iVar1 = SSL_CTX_get_verify_callback((int)c,pXVar2);
  SSL_set_verify((SSL *)s,mode,(callback *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void set_context(stream_handle_type s, context_handle_type c)
{
#if defined TORRENT_USE_OPENSSL
	SSL_set_SSL_CTX(s, c);
	SSL_set_verify(s
		, SSL_CTX_get_verify_mode(c)
		, SSL_CTX_get_verify_callback(c));
#elif defined TORRENT_USE_GNUTLS
	s->set_context(*c);
#endif
}